

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O0

AsyncGeneratorRequest * __thiscall
Js::JavascriptAsyncGenerator::PeekRequest(JavascriptAsyncGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount> *pDVar3;
  undefined4 *puVar4;
  AsyncGeneratorRequest **ppAVar5;
  JavascriptAsyncGenerator *this_local;
  
  pDVar3 = Memory::
           WriteBarrierPtr<DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount>_>
           ::operator->(&this->requestQueue);
  bVar2 = DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>::Empty
                    (&pDVar3->
                      super_DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>
                    );
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptAsyncGenerator.h"
                                ,0x49,"(!requestQueue->Empty())","!requestQueue->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDVar3 = Memory::
           WriteBarrierPtr<DList<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_Memory::Recycler,_RealCount>_>
           ::operator->(&this->requestQueue);
  ppAVar5 = DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>::Head
                      (&pDVar3->
                        super_DListBase<Js::JavascriptAsyncGenerator::AsyncGeneratorRequest_*,_RealCount>
                      );
  return *ppAVar5;
}

Assistant:

AsyncGeneratorRequest* PeekRequest()
    {
        Assert(!requestQueue->Empty());
        return requestQueue->Head();
    }